

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Type * enum_specifier(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Type *pCVar2;
  char *pcVar3;
  C_Node *node;
  int64_t iVar4;
  void *val;
  int iVar5;
  C_Token *tok_00;
  int iVar6;
  C_Scope *pCVar7;
  bool bVar8;
  C_Token *local_48;
  C_Token **local_40;
  C_Token *local_38;
  
  local_48 = tok;
  local_40 = rest;
  pCVar2 = C_enum_type(parser);
  if (local_48->kind == TK_IDENT) {
    tok_00 = local_48;
    local_48 = local_48->next;
  }
  else {
    tok_00 = (C_Token *)0x0;
  }
  if ((tok_00 == (C_Token *)0x0) || (_Var1 = C_equal(local_48,"{"), _Var1)) {
    local_38 = tok_00;
    local_48 = C_skip(parser,local_48,"{");
    _Var1 = consume_end(local_40,local_48);
    if (!_Var1) {
      iVar6 = 0;
      iVar5 = 0;
      do {
        bVar8 = iVar6 != 0;
        iVar6 = iVar6 + -1;
        if (bVar8) {
          local_48 = C_skip(parser,local_48,",");
        }
        pcVar3 = get_ident(parser,local_48);
        local_48 = local_48->next;
        _Var1 = C_equal(local_48,"=");
        if (_Var1) {
          node = conditional(parser,&local_48,local_48->next);
          iVar4 = eval2(parser,node,(char ***)0x0);
          iVar5 = (int)iVar4;
        }
        val = (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x20);
        hashmap_put(&parser->scope->vars,pcVar3,val);
        *(C_Type **)((long)val + 0x10) = pCVar2;
        *(int *)((long)val + 0x18) = iVar5;
        iVar5 = iVar5 + 1;
        _Var1 = consume_end(local_40,local_48);
      } while (!_Var1);
    }
    if (local_38 != (C_Token *)0x0) {
      hashmap_put2(&parser->scope->tags,local_38->loc,local_38->len,pCVar2);
    }
    return pCVar2;
  }
  pCVar7 = (C_Scope *)&parser->scope;
  do {
    pCVar7 = pCVar7->next;
    if (pCVar7 == (C_Scope *)0x0) {
      pCVar2 = (C_Type *)0x0;
      break;
    }
    pCVar2 = (C_Type *)hashmap_get2(&pCVar7->tags,tok_00->loc,tok_00->len);
  } while (pCVar2 == (C_Type *)0x0);
  if (pCVar2 == (C_Type *)0x0) {
    pcVar3 = "unknown enum type";
  }
  else {
    if (pCVar2->kind == TY_ENUM) {
      *local_40 = local_48;
      return pCVar2;
    }
    pcVar3 = "not an enum tag";
  }
  C_error_tok(parser,tok_00,pcVar3);
}

Assistant:

static C_Type *enum_specifier(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = C_enum_type(parser);

  // Read a struct tag.
  C_Token *tag = NULL;
  if (tok->kind == TK_IDENT) {
    tag = tok;
    tok = tok->next;
  }

  if (tag && !C_equal(tok, "{")) {
    C_Type *ty = find_tag(parser, tag);
    if (!ty)
      C_error_tok(parser, tag, "unknown enum type");
    if (ty->kind != TY_ENUM)
      C_error_tok(parser, tag, "not an enum tag");
    *rest = tok;
    return ty;
  }

  tok = C_skip(parser, tok, "{");

  // Read an enum-list.
  int i = 0;
  int val = 0;
  while (!consume_end(rest, tok)) {
    if (i++ > 0)
      tok = C_skip(parser, tok, ",");

    char *name = get_ident(parser, tok);
    tok = tok->next;

    if (C_equal(tok, "="))
      val = C_const_expr(parser, &tok, tok->next);

    C_VarScope *sc = push_scope(parser, name);
    sc->enum_ty = ty;
    sc->enum_val = val++;
  }

  if (tag)
    push_tag_scope(parser, tag, ty);
  return ty;
}